

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuleParser.cpp
# Opt level: O1

void __thiscall Refal2::CRuleParser::AddToken(CRuleParser *this)

{
  code *pcVar1;
  
  if ((this->super_CQualifierParser).super_CParsingElementState.state == PES_NotFinished) {
    CError::SetToken((CError *)this,&(this->super_CQualifierParser).token);
    pcVar1 = (code *)this->state;
    if (((ulong)pcVar1 & 1) != 0) {
      pcVar1 = *(code **)(pcVar1 + *(long *)((long)&(this->super_CQualifierParser).
                                                    super_CModuleBuilder.super_CProgramBuilder.
                                                    super_CFunctionBuilder.super_CVariablesBuilder.
                                                    super_CErrorsHelper.super_CError +
                                            *(long *)&this->field_0x1e80) + -1);
    }
    (*pcVar1)();
    CError::ResetToken((CError *)this);
    return;
  }
  __assert_fail("!IsFinished()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/RuleParser.cpp"
                ,0x3e,"void Refal2::CRuleParser::AddToken()");
}

Assistant:

bool CRuleParser::BeginFunction()
{
	assert( token.type == TT_Word && !token.word.empty() );
	if( CModuleBuilder::Declare( token ) != InvalidDictionaryIndex ) {
		functionName = token;
		beginRule();
		return true;
	}
	return false;
}